

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O2

void * stb_realloc(void *ptr,size_t newsize)

{
  uint uVar1;
  undefined8 *puVar2;
  void *pvVar3;
  long *plVar4;
  long *plVar5;
  void **q_1;
  long lVar6;
  
  if (ptr == (void *)0x0) {
    pvVar3 = stb_malloc((void *)0x0,newsize);
    return pvVar3;
  }
  if (newsize == 0) {
    stb_free(ptr);
LAB_0014d3da:
    plVar5 = (long *)0x0;
  }
  else {
    uVar1 = *(uint *)((long)ptr + -8) & 3;
    if (uVar1 == 0) {
      plVar4 = (long *)realloc(ptr,newsize + 8);
      if (plVar4 == (long *)0x0) goto LAB_0014d3da;
      plVar5 = plVar4 + 2;
      *(long **)plVar4[1] = plVar5;
      lVar6 = *plVar4;
      if (lVar6 == 0) {
        return plVar5;
      }
    }
    else {
      if (uVar1 != 2) {
        __assert_fail("t == STB__alloc || t == STB__nochildren",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sienkiewiczkm[P]ltc_fitter/dependencies/stb/stb.h"
                      ,0xb58,"void *stb_realloc(void *, size_t)");
      }
      puVar2 = (undefined8 *)realloc((void *)((long)ptr + -0x20),newsize + 0x20);
      if (puVar2 == (undefined8 *)0x0) goto LAB_0014d3da;
      plVar5 = puVar2 + 4;
      *(long **)*puVar2 = plVar5;
      lVar6 = puVar2[2];
      if (lVar6 != 0) {
        plVar4 = (long *)(lVar6 + -0x20);
        if ((*(uint *)(lVar6 + -8) & 3) != 2) {
          plVar4 = (long *)(lVar6 + -8);
        }
        *plVar4 = (long)(puVar2 + 2);
      }
      lVar6 = puVar2[1];
      if (lVar6 == 0) {
        return plVar5;
      }
      plVar4 = puVar2 + 1;
    }
    puVar2 = (undefined8 *)(lVar6 + -0x20);
    if ((*(uint *)(lVar6 + -8) & 3) != 2) {
      puVar2 = (undefined8 *)(lVar6 + -8);
    }
    *puVar2 = plVar4;
  }
  return plVar5;
}

Assistant:

void *stb_realloc(void *ptr, size_t newsize)
{
   stb__alloc_type t;

   if (ptr == NULL) return stb_malloc(NULL, newsize);
   if (newsize == 0) { stb_free(ptr); return NULL; }
   
   t = stb__identify(ptr);
   assert(t == STB__alloc || t == STB__nochildren);

   if (t == STB__alloc) {
      stb__alloc *s = (stb__alloc *) ptr - 1;

      s = (stb__alloc *) realloc(s, newsize + sizeof(*s));
      if (s == NULL) return NULL;

      ptr = s+1;

      // update pointers
      (*s->prevn) = ptr;
      if (s->next)
         *stb__prevn(s->next) = &s->next;

      if (s->child)
         *stb__prevn(s->child) = &s->child;

      return ptr;
   } else {
      stb__nochildren *s = (stb__nochildren *) ptr - 1;

      s = (stb__nochildren *) realloc(ptr, newsize + sizeof(s));
      if (s == NULL) return NULL;

      // update pointers
      (*s->prevn) = s+1;
      if (s->next)
         *stb__prevn(s->next) = &s->next;

      return s+1;
   }
}